

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O1

X509_POLICY_NODE * x509_policy_level_find(X509_POLICY_LEVEL *level,ASN1_OBJECT *policy)

{
  int iVar1;
  X509_POLICY_NODE *pXVar2;
  size_t idx;
  X509_POLICY_NODE node;
  size_t local_30;
  ASN1_OBJECT *local_28 [3];
  
  iVar1 = OPENSSL_sk_is_sorted((OPENSSL_STACK *)level->nodes);
  if (iVar1 != 0) {
    local_28[0] = policy;
    iVar1 = OPENSSL_sk_find((OPENSSL_STACK *)level->nodes,&local_30,local_28,
                            sk_X509_POLICY_NODE_call_cmp_func);
    if (iVar1 == 0) {
      pXVar2 = (X509_POLICY_NODE *)0x0;
    }
    else {
      pXVar2 = (X509_POLICY_NODE *)OPENSSL_sk_value((OPENSSL_STACK *)level->nodes,local_30);
    }
    return pXVar2;
  }
  __assert_fail("sk_X509_POLICY_NODE_is_sorted(level->nodes)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                ,0xa4,
                "X509_POLICY_NODE *x509_policy_level_find(X509_POLICY_LEVEL *, const ASN1_OBJECT *)"
               );
}

Assistant:

static X509_POLICY_NODE *x509_policy_level_find(X509_POLICY_LEVEL *level,
                                                const ASN1_OBJECT *policy) {
  assert(sk_X509_POLICY_NODE_is_sorted(level->nodes));
  X509_POLICY_NODE node;
  node.policy = (ASN1_OBJECT *)policy;
  size_t idx;
  if (!sk_X509_POLICY_NODE_find(level->nodes, &idx, &node)) {
    return NULL;
  }
  return sk_X509_POLICY_NODE_value(level->nodes, idx);
}